

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O2

int __thiscall
nv::FloatImage::clone(FloatImage *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ushort uVar1;
  ushort uVar2;
  undefined4 c;
  undefined4 uVar3;
  FloatImage *this_00;
  
  this_00 = (FloatImage *)operator_new(0x20);
  this_00->_vptr_FloatImage = (_func_int **)&PTR__FloatImage_0023d850;
  this_00->m_mem = (float *)0x0;
  uVar1 = this->m_width;
  this_00->m_width = uVar1;
  uVar2 = this->m_height;
  this_00->m_height = uVar2;
  c = this->m_componentNum;
  uVar3 = this->m_count;
  this_00->m_componentNum = c;
  this_00->m_count = uVar3;
  if (this->m_mem != (float *)0x0) {
    allocate(this_00,c,(uint)uVar1,(uint)uVar2);
    memcpy(this_00->m_mem,this->m_mem,(ulong)this->m_count << 2);
  }
  return (int)this_00;
}

Assistant:

FloatImage* FloatImage::clone() const
{
	FloatImage* copy = new FloatImage();
	copy->m_width = m_width;
	copy->m_height = m_height;
	copy->m_componentNum = m_componentNum;
	copy->m_count = m_count;
	
	if(m_mem)
	{
		copy->allocate(m_componentNum, m_width, m_height);
		memcpy(copy->m_mem, m_mem, m_count * sizeof(float));
	}
		
	return copy;
}